

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QAbstractFileIconProvider::IconType,_QIcon>_>::Data
          (Data<QHashPrivate::Node<QAbstractFileIconProvider::IconType,_QIcon>_> *this,
          Data<QHashPrivate::Node<QAbstractFileIconProvider::IconType,_QIcon>_> *other)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Node<QAbstractFileIconProvider::IconType,_QIcon> *pNVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  R RVar8;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar6 = other->numBuckets;
  sVar7 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar7;
  this->spans = (Span *)0x0;
  RVar8 = allocateSpans(sVar6);
  this->spans = (Span *)RVar8.spans;
  if (RVar8.nSpans != 0) {
    lVar5 = 0;
    sVar6 = 0;
    do {
      pSVar2 = other->spans;
      sVar7 = 0;
      do {
        bVar1 = pSVar2->offsets[sVar7 + lVar5];
        if (bVar1 != 0xff) {
          pEVar3 = pSVar2[sVar6].entries;
          pNVar4 = Span<QHashPrivate::Node<QAbstractFileIconProvider::IconType,_QIcon>_>::insert
                             (this->spans + sVar6,sVar7);
          pEVar3 = pEVar3 + bVar1;
          pNVar4->key = *(IconType *)(pEVar3->storage).data;
          QIcon::QIcon(&pNVar4->value,(QIcon *)((pEVar3->storage).data + 8));
        }
        sVar7 = sVar7 + 1;
      } while (sVar7 != 0x80);
      sVar6 = sVar6 + 1;
      lVar5 = lVar5 + 0x90;
    } while (sVar6 != RVar8.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }